

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateRayTracingBuiltinsAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  BuiltIn BVar2;
  spv_const_context psVar3;
  DiagnosticStream *pDVar4;
  AssemblyGrammar *pAVar5;
  reference pEVar6;
  mapped_type *this_00;
  BuiltInsValidator *local_660;
  code *local_658;
  undefined8 local_650;
  type local_648;
  value_type local_4f8;
  uint32_t local_4d4;
  string local_4d0;
  char *local_4b0;
  char *local_4a8;
  string local_4a0;
  DiagnosticStream local_480;
  uint32_t local_2a8;
  ExecutionModel local_2a4;
  uint32_t vuid_1;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  string local_268;
  char *local_248;
  string local_240;
  DiagnosticStream local_220;
  uint32_t local_44;
  StorageClass local_40;
  uint32_t vuid;
  StorageClass storage_class;
  BuiltIn builtin;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _storage_class = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar3 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  if (bVar1) {
    vuid = Decoration::builtin((Decoration *)built_in_inst_local);
    local_40 = GetStorageClass(_storage_class);
    if ((local_40 != Max) && (local_40 != Input)) {
      local_44 = GetVUIDForBuiltin(vuid,VUIDErrorStorageClass);
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_240,this->_,local_44,(char *)0x0);
      pDVar4 = DiagnosticStream::operator<<(&local_220,&local_240);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [28])"Vulkan spec allows BuiltIn ");
      pAVar5 = ValidationState_t::grammar(this->_);
      BVar2 = Decoration::builtin((Decoration *)built_in_inst_local);
      local_248 = AssemblyGrammar::lookupOperandName(pAVar5,SPV_OPERAND_TYPE_BUILT_IN,BVar2);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_248);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [58])0x621107);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_268,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,_storage_class,Max);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_268);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [2])0x634f49);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                ((string *)&__range3,this,_storage_class);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&__range3);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      std::__cxx11::string::~string((string *)&__range3);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _vuid_1 = std::
              set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
              ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&vuid_1), bVar1) {
      pEVar6 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_2a4 = *pEVar6;
      bVar1 = IsExecutionModelValidForRtBuiltIn(vuid,local_2a4);
      if (!bVar1) {
        local_2a8 = GetVUIDForBuiltin(vuid,VUIDErrorExecutionModel);
        ValidationState_t::diag(&local_480,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_4a0,this->_,local_2a8,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_480,&local_4a0);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [36])"Vulkan spec does not allow BuiltIn ");
        pAVar5 = ValidationState_t::grammar(this->_);
        BVar2 = Decoration::builtin((Decoration *)built_in_inst_local);
        local_4a8 = AssemblyGrammar::lookupOperandName(pAVar5,SPV_OPERAND_TYPE_BUILT_IN,BVar2);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_4a8);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [38])" to be used with the execution model ");
        pAVar5 = ValidationState_t::grammar(this->_);
        local_4b0 = AssemblyGrammar::lookupOperandName
                              (pAVar5,SPV_OPERAND_TYPE_EXECUTION_MODEL,local_2a4);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_4b0);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [3])0x5d65b3);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_4d0,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                   referenced_from_inst_local,_storage_class,local_2a4);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_4d0);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4a0);
        DiagnosticStream::~DiagnosticStream(&local_480);
        return this_local._4_4_;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_4d4 = Instruction::id(_storage_class);
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_4d4);
    local_658 = ValidateRayTracingBuiltinsAtReference;
    local_650 = 0;
    local_660 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_648,(offset_in_BuiltInsValidator_to_subr *)&local_658,&local_660,
               (Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_4f8,&local_648);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,&local_4f8);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_4f8);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_648);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateRayTracingBuiltinsAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorStorageClass);
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              (uint32_t)decoration.builtin())
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (!IsExecutionModelValidForRtBuiltIn(builtin, execution_model)) {
        uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorExecutionModel);
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(vuid) << "Vulkan spec does not allow BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                (uint32_t)decoration.builtin())
               << " to be used with the execution model "
               << _.grammar().lookupOperandName(
                      SPV_OPERAND_TYPE_EXECUTION_MODEL,
                      uint32_t(execution_model))
               << ".\n"
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateRayTracingBuiltinsAtReference,
                  this, decoration, built_in_inst, referenced_from_inst,
                  std::placeholders::_1));
  }

  return SPV_SUCCESS;
}